

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.cxx
# Opt level: O1

void __thiscall
cmCTestRunTest::WriteLogOutputTop(cmCTestRunTest *this,size_t completed,size_t total)

{
  pointer pcVar1;
  pointer pbVar2;
  cmCTest *pcVar3;
  char cVar4;
  bool bVar5;
  int iVar6;
  ostream *poVar7;
  uint uVar8;
  ulong uVar9;
  string *arg;
  pointer pbVar10;
  long lVar11;
  char *pcVar12;
  string outname;
  ostringstream cmCTestLog_msg;
  ostringstream outputStream;
  ostringstream indexStr;
  long *local_4d8;
  long local_4d0;
  long local_4c8 [2];
  long *local_4b8;
  long local_4b0;
  long local_4a8 [2];
  undefined1 local_498 [16];
  _func_int *local_488 [12];
  ios_base local_428 [264];
  undefined1 local_320 [112];
  ios_base local_2b0 [264];
  undefined1 local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
  uVar8 = this->RepeatMode + ~AfterTimeout;
  if ((uVar8 < 0xfffffffe && this->NumberOfRunsLeft == 1) ||
     (((0xfffffffd < uVar8 && (this->NumberOfRunsLeft == this->NumberOfRunsTotal)) ||
      (bVar5 = cmCTest::GetTestProgressOutput(this->CTest), bVar5)))) {
    lVar11 = 1;
    uVar9 = total;
    if (9 < total) {
      do {
        lVar11 = lVar11 + 1;
        bVar5 = 99 < uVar9;
        uVar9 = uVar9 / 10;
      } while (bVar5);
    }
    *(long *)(*(_func_int **)(local_320._0_8_ + -0x18) + (long)(local_320 + 0x10)) = lVar11;
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)local_320);
    lVar11 = 1;
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"/",1);
    if (9 < total) {
      lVar11 = 1;
      do {
        lVar11 = lVar11 + 1;
        bVar5 = 99 < total;
        total = total / 10;
      } while (bVar5);
    }
    *(long *)(*(_func_int **)(local_320._0_8_ + -0x18) + (long)(local_320 + 0x10)) = lVar11;
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)local_320);
    lVar11 = 1;
    pcVar12 = " ";
  }
  else {
    lVar11 = 1;
    uVar9 = total;
    if (9 < total) {
      do {
        lVar11 = lVar11 + 1;
        bVar5 = 99 < uVar9;
        uVar9 = uVar9 / 10;
      } while (bVar5);
    }
    poVar7 = (ostream *)local_320;
    *(long *)(*(_func_int **)(local_320._0_8_ + -0x18) + (long)(local_320 + 0x10)) = lVar11;
    pcVar12 = "  ";
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  ",2);
    lVar11 = 1;
    if (9 < total) {
      do {
        lVar11 = lVar11 + 1;
        bVar5 = 99 < total;
        total = total / 10;
      } while (bVar5);
    }
    *(long *)(*(_func_int **)(local_320._0_8_ + -0x18) + (long)(local_320 + 0x10)) = lVar11;
    lVar11 = 2;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar12,lVar11);
  bVar5 = this->TestHandler->MemCheck;
  pcVar12 = "Test";
  if (bVar5 != false) {
    pcVar12 = "MemCheck";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,pcVar12,(ulong)bVar5 * 4 + 4);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," #",2);
  poVar7 = (ostream *)std::ostream::operator<<(local_1a8,this->Index);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,":",1);
  uVar9 = (ulong)this->TestHandler->MaxIndex;
  lVar11 = 4;
  if (9 < uVar9) {
    do {
      lVar11 = lVar11 + 1;
      bVar5 = 99 < uVar9;
      uVar9 = uVar9 / 10;
    } while (bVar5);
  }
  *(long *)(*(_func_int **)(local_320._0_8_ + -0x18) + (long)(local_320 + 0x10)) = lVar11;
  std::__cxx11::stringbuf::str();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,(char *)local_498._0_8_,local_498._8_8_);
  if ((_func_int **)local_498._0_8_ != local_488) {
    operator_delete((void *)local_498._0_8_,(ulong)(local_488[0] + 1));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320," ",1);
  iVar6 = cmCTest::GetMaxTestNameWidth(this->CTest);
  local_4b8 = local_4a8;
  pcVar1 = (this->TestProperties->Name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4b8,pcVar1,pcVar1 + (this->TestProperties->Name)._M_string_length);
  std::__cxx11::string::append((char *)&local_4b8);
  std::__cxx11::string::resize((ulong)&local_4b8,(char)iVar6 + '\x04');
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,(char *)local_4b8,local_4b0);
  poVar7 = (ostream *)
           std::ostream::operator<<(this->TestHandler->LogFile,this->TestProperties->Index);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"/",1);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," Testing: ",10);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,(this->TestProperties->Name)._M_dataplus._M_p,
                      (this->TestProperties->Name)._M_string_length);
  std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  poVar7 = (ostream *)
           std::ostream::operator<<(this->TestHandler->LogFile,this->TestProperties->Index);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"/",1);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," Test: ",7);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,(this->TestProperties->Name)._M_dataplus._M_p,
                      (this->TestProperties->Name)._M_string_length);
  std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  poVar7 = this->TestHandler->LogFile;
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"Command: \"",10);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,(this->ActualCommand)._M_dataplus._M_p,
                      (this->ActualCommand)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"",1);
  pbVar2 = (this->Arguments).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar10 = (this->Arguments).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pbVar10 != pbVar2; pbVar10 = pbVar10 + 1
      ) {
    poVar7 = this->TestHandler->LogFile;
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," \"",2);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,(pbVar10->_M_dataplus)._M_p,pbVar10->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"",1);
  }
  poVar7 = this->TestHandler->LogFile;
  cVar4 = (char)poVar7;
  std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + cVar4);
  std::ostream::put(cVar4);
  poVar7 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"Directory: ",0xb);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,(this->TestProperties->Directory)._M_dataplus._M_p,
                      (this->TestProperties->Directory)._M_string_length);
  std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
  std::ostream::put((char)poVar7);
  poVar7 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"",1);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,(this->TestProperties->Name)._M_dataplus._M_p,
                      (this->TestProperties->Name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\" start time: ",0xe);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,(this->StartTime)._M_dataplus._M_p,(this->StartTime)._M_string_length);
  std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  poVar7 = this->TestHandler->LogFile;
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"Output:",7);
  std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
  std::ostream::put((char)poVar7);
  poVar7 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,"----------------------------------------------------------",0x3a);
  std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (this->TestHandler->LogFile,(this->ProcessOutput)._M_dataplus._M_p,
                      (this->ProcessOutput)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"<end of output>",0xf);
  std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  bVar5 = cmCTest::GetTestProgressOutput(this->CTest);
  if (!bVar5) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_498);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_498,(char *)local_4d8,local_4d0);
    if (local_4d8 != local_4c8) {
      operator_delete(local_4d8,local_4c8[0] + 1);
    }
    pcVar3 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar3,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0x3b5,(char *)local_4d8,false);
    if (local_4d8 != local_4c8) {
      operator_delete(local_4d8,local_4c8[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_498);
    std::ios_base::~ios_base(local_428);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_498);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498,"Testing ",8);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_498,(this->TestProperties->Name)._M_dataplus._M_p,
                      (this->TestProperties->Name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," ... ",5);
  pcVar3 = this->CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar3,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestRunTest.cxx"
               ,0x3b9,(char *)local_4d8,false);
  if (local_4d8 != local_4c8) {
    operator_delete(local_4d8,local_4c8[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_498);
  std::ios_base::~ios_base(local_428);
  if (local_4b8 != local_4a8) {
    operator_delete(local_4b8,local_4a8[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
  std::ios_base::~ios_base((ios_base *)(local_320 + 0x70));
  return;
}

Assistant:

void cmCTestRunTest::WriteLogOutputTop(size_t completed, size_t total)
{
  std::ostringstream outputStream;

  // If this is the last or only run of this test, or progress output is
  // requested, then print out completed / total.
  // Only issue is if a test fails and we are running until fail
  // then it will never print out the completed / total, same would
  // got for run until pass.  Trick is when this is called we don't
  // yet know if we are passing or failing.
  bool const progressOnLast =
    (this->RepeatMode != cmCTest::Repeat::UntilPass &&
     this->RepeatMode != cmCTest::Repeat::AfterTimeout);
  if ((progressOnLast && this->NumberOfRunsLeft == 1) ||
      (!progressOnLast && this->NumberOfRunsLeft == this->NumberOfRunsTotal) ||
      this->CTest->GetTestProgressOutput()) {
    outputStream << std::setw(getNumWidth(total)) << completed << "/";
    outputStream << std::setw(getNumWidth(total)) << total << " ";
  }
  // if this is one of several runs of a test just print blank space
  // to keep things neat
  else {
    outputStream << std::setw(getNumWidth(total)) << "  ";
    outputStream << std::setw(getNumWidth(total)) << "  ";
  }

  if (this->TestHandler->MemCheck) {
    outputStream << "MemCheck";
  } else {
    outputStream << "Test";
  }

  std::ostringstream indexStr;
  indexStr << " #" << this->Index << ":";
  outputStream << std::setw(3 + getNumWidth(this->TestHandler->GetMaxIndex()))
               << indexStr.str();
  outputStream << " ";

  const int maxTestNameWidth = this->CTest->GetMaxTestNameWidth();
  std::string outname = this->TestProperties->Name + " ";
  outname.resize(maxTestNameWidth + 4, '.');
  outputStream << outname;

  *this->TestHandler->LogFile << this->TestProperties->Index << "/"
                              << this->TestHandler->TotalNumberOfTests
                              << " Testing: " << this->TestProperties->Name
                              << std::endl;
  *this->TestHandler->LogFile << this->TestProperties->Index << "/"
                              << this->TestHandler->TotalNumberOfTests
                              << " Test: " << this->TestProperties->Name
                              << std::endl;
  *this->TestHandler->LogFile << "Command: \"" << this->ActualCommand << "\"";

  for (std::string const& arg : this->Arguments) {
    *this->TestHandler->LogFile << " \"" << arg << "\"";
  }
  *this->TestHandler->LogFile
    << std::endl
    << "Directory: " << this->TestProperties->Directory << std::endl
    << "\"" << this->TestProperties->Name
    << "\" start time: " << this->StartTime << std::endl;

  *this->TestHandler->LogFile
    << "Output:" << std::endl
    << "----------------------------------------------------------"
    << std::endl;
  *this->TestHandler->LogFile << this->ProcessOutput << "<end of output>"
                              << std::endl;

  if (!this->CTest->GetTestProgressOutput()) {
    cmCTestLog(this->CTest, HANDLER_OUTPUT, outputStream.str());
  }

  cmCTestLog(this->CTest, DEBUG,
             "Testing " << this->TestProperties->Name << " ... ");
}